

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackArchiveGenerator.cxx
# Opt level: O0

int __thiscall cmCPackArchiveGenerator::PackageComponentsAllInOne(cmCPackArchiveGenerator *this)

{
  cmCPackLog *pcVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  undefined4 extraout_var;
  reference pvVar5;
  ostream *poVar6;
  pointer ppVar7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  _Self local_900;
  _Base_ptr local_8f8;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>
  local_8f0;
  iterator compIt;
  string local_8c8;
  undefined1 local_8a8 [8];
  ostringstream cmCPackLog_msg_2;
  undefined1 local_730 [8];
  cmArchiveWrite archive;
  string local_648 [32];
  undefined1 local_628 [8];
  ostringstream cmCPackLog_msg_1;
  undefined1 local_4b0 [8];
  cmGeneratedFileStream gf;
  ostringstream local_248 [8];
  ostringstream cmCPackLog_msg;
  allocator local_ca;
  allocator local_c9;
  string local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  value_type local_38;
  cmCPackArchiveGenerator *local_18;
  cmCPackArchiveGenerator *this_local;
  
  this_00 = &(this->super_cmCPackGenerator).packageFileNames;
  local_18 = this;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(this_00);
  std::__cxx11::string::string
            ((string *)&local_38,(string *)&(this->super_cmCPackGenerator).toplevel);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(this_00,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_c8,"CPACK_PACKAGE_FILE_NAME",&local_c9);
  pcVar4 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_a8,pcVar4,&local_ca);
  std::operator+(&local_88,"/",&local_a8);
  iVar3 = (*(this->super_cmCPackGenerator).super_cmObject._vptr_cmObject[5])();
  std::operator+(&local_68,&local_88,(char *)CONCAT44(extraout_var,iVar3));
  pvVar5 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](&(this->super_cmCPackGenerator).packageFileNames,0);
  std::__cxx11::string::operator+=((string *)pvVar5,(string *)&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_ca);
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_c9);
  std::__cxx11::ostringstream::ostringstream(local_248);
  poVar6 = std::operator<<((ostream *)local_248,
                           "Packaging all groups in one package...(CPACK_COMPONENTS_ALL_GROUPS_IN_ONE_PACKAGE is set)"
                          );
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  pcVar1 = (this->super_cmCPackGenerator).Logger;
  std::__cxx11::ostringstream::str();
  pcVar4 = (char *)std::__cxx11::string::c_str();
  cmCPackLog::Log(pcVar1,2,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                  ,0xeb,pcVar4);
  std::__cxx11::string::~string((string *)&gf.field_0x240);
  std::__cxx11::ostringstream::~ostringstream(local_248);
  cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)local_4b0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[](&(this->super_cmCPackGenerator).packageFileNames,0);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  cmGeneratedFileStream::Open((cmGeneratedFileStream *)local_4b0,pcVar4,false,true);
  iVar3 = (*(this->super_cmCPackGenerator).super_cmObject._vptr_cmObject[0x1c])(this,local_4b0);
  if (iVar3 == 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_628);
    poVar6 = std::operator<<((ostream *)local_628,"Problem to generate Header for archive < ");
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&(this->super_cmCPackGenerator).packageFileNames,0);
    poVar6 = std::operator<<(poVar6,(string *)pvVar5);
    poVar6 = std::operator<<(poVar6,">.");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    pcVar1 = (this->super_cmCPackGenerator).Logger;
    std::__cxx11::ostringstream::str();
    pcVar4 = (char *)std::__cxx11::string::c_str();
    cmCPackLog::Log(pcVar1,0x10,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                    ,0xec,pcVar4);
    std::__cxx11::string::~string(local_648);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_628);
    this_local._4_4_ = 0;
    archive.PermissionsMask.IsValueSet = true;
    archive.PermissionsMask._5_3_ = 0;
  }
  else {
    cmArchiveWrite::cmArchiveWrite
              ((cmArchiveWrite *)local_730,(ostream *)local_4b0,this->Compress,&this->ArchiveFormat)
    ;
    bVar2 = cmArchiveWrite::operator!((cmArchiveWrite *)local_730);
    if (bVar2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_8a8);
      poVar6 = std::operator<<((ostream *)local_8a8,"Problem to create archive < ");
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&(this->super_cmCPackGenerator).packageFileNames,0);
      poVar6 = std::operator<<(poVar6,(string *)pvVar5);
      poVar6 = std::operator<<(poVar6,">. ERROR =");
      cmArchiveWrite::GetError_abi_cxx11_(&local_8c8,(cmArchiveWrite *)local_730);
      poVar6 = std::operator<<(poVar6,(string *)&local_8c8);
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string((string *)&local_8c8);
      pcVar1 = (this->super_cmCPackGenerator).Logger;
      std::__cxx11::ostringstream::str();
      pcVar4 = (char *)std::__cxx11::string::c_str();
      cmCPackLog::Log(pcVar1,0x10,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackArchiveGenerator.cxx"
                      ,0xec,pcVar4);
      std::__cxx11::string::~string((string *)&compIt);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_8a8);
      this_local._4_4_ = 0;
    }
    else {
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>
      ::_Rb_tree_iterator(&local_8f0);
      local_8f8 = (_Base_ptr)
                  std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>_>
                  ::begin(&(this->super_cmCPackGenerator).Components);
      local_8f0._M_node = local_8f8;
      while( true ) {
        local_900._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>_>
             ::end(&(this->super_cmCPackGenerator).Components);
        bVar2 = std::operator!=(&local_8f0,&local_900);
        if (!bVar2) break;
        ppVar7 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>
                 ::operator->(&local_8f0);
        addOneComponentToArchive(this,(cmArchiveWrite *)local_730,&ppVar7->second);
        std::
        _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>
        ::operator++(&local_8f0);
      }
      this_local._4_4_ = 1;
    }
    archive.PermissionsMask.IsValueSet = true;
    archive.PermissionsMask._5_3_ = 0;
    cmArchiveWrite::~cmArchiveWrite((cmArchiveWrite *)local_730);
  }
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_4b0);
  return this_local._4_4_;
}

Assistant:

int cmCPackArchiveGenerator::PackageComponentsAllInOne()
{
  // reset the package file names
  packageFileNames.clear();
  packageFileNames.push_back(std::string(toplevel));
  packageFileNames[0] += "/"
    +std::string(this->GetOption("CPACK_PACKAGE_FILE_NAME"))
    + this->GetOutputExtension();
  cmCPackLogger(cmCPackLog::LOG_VERBOSE,
                "Packaging all groups in one package..."
                "(CPACK_COMPONENTS_ALL_GROUPS_IN_ONE_PACKAGE is set)"
      << std::endl);
  DECLARE_AND_OPEN_ARCHIVE(packageFileNames[0],archive);

  // The ALL COMPONENTS in ONE package case
  std::map<std::string, cmCPackComponent>::iterator compIt;
  for (compIt=this->Components.begin();compIt!=this->Components.end();
      ++compIt )
    {
    // Add the files of this component to the archive
    addOneComponentToArchive(archive,&(compIt->second));
    }

  // archive goes out of scope so it will finalized and closed.
  return 1;
}